

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Bitmask sqlite3ExprColUsed(Expr *pExpr)

{
  short sVar1;
  Table *pTVar2;
  Bitmask BVar3;
  short sVar4;
  
  sVar1 = pExpr->iColumn;
  pTVar2 = (pExpr->y).pTab;
  if (((pTVar2->tabFlags & 0x60) != 0) && ((pTVar2->aCol[sVar1].colFlags & 0x60) != 0)) {
    BVar3 = ~(-1L << ((byte)pTVar2->nCol & 0x3f));
    if (0x3f < pTVar2->nCol) {
      BVar3 = 0xffffffffffffffff;
    }
    return BVar3;
  }
  sVar4 = 0x3f;
  if (sVar1 < 0x3f) {
    sVar4 = sVar1;
  }
  return 1L << ((byte)sVar4 & 0x3f);
}

Assistant:

SQLITE_PRIVATE Bitmask sqlite3ExprColUsed(Expr *pExpr){
  int n;
  Table *pExTab;

  n = pExpr->iColumn;
  assert( ExprUseYTab(pExpr) );
  pExTab = pExpr->y.pTab;
  assert( pExTab!=0 );
  assert( n < pExTab->nCol );
  if( (pExTab->tabFlags & TF_HasGenerated)!=0
   && (pExTab->aCol[n].colFlags & COLFLAG_GENERATED)!=0
  ){
    testcase( pExTab->nCol==BMS-1 );
    testcase( pExTab->nCol==BMS );
    return pExTab->nCol>=BMS ? ALLBITS : MASKBIT(pExTab->nCol)-1;
  }else{
    testcase( n==BMS-1 );
    testcase( n==BMS );
    if( n>=BMS ) n = BMS-1;
    return ((Bitmask)1)<<n;
  }
}